

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O2

GLuint __thiscall
QOpenGL2PaintEngineExPrivate::bindTexture<ImageWithBindOptions>
          (QOpenGL2PaintEngineExPrivate *this,ImageWithBindOptions *imageWithOptions,
          bool *newTextureCreated)

{
  Data *pDVar1;
  QOpenGLTextureCache *this_00;
  BindResult BVar2;
  QOpenGLContext *context;
  QObject *context_00;
  
  pDVar1 = (this->ctx).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    context_00 = (QObject *)0x0;
  }
  else {
    context_00 = (this->ctx).wp.value;
  }
  this_00 = QOpenGLTextureCache::cacheForContext((QOpenGLContext *)context_00);
  pDVar1 = (this->ctx).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    context = (QOpenGLContext *)0x0;
  }
  else {
    context = (QOpenGLContext *)(this->ctx).wp.value;
  }
  BVar2 = QOpenGLTextureCache::bindTexture
                    (this_00,context,imageWithOptions->image,
                     (BindOptions)
                     (imageWithOptions->options).
                     super_QFlagsStorageHelper<QOpenGLTextureUploader::BindOption,_4>.
                     super_QFlagsStorage<QOpenGLTextureUploader::BindOption>.i);
  if (newTextureCreated != (bool *)0x0) {
    *newTextureCreated =
         (bool)((byte)BVar2.flags.super_QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>.
                      super_QFlagsStorage<QOpenGLTextureCache::BindResultFlag>.i & 1);
  }
  return BVar2.id;
}

Assistant:

GLuint QOpenGL2PaintEngineExPrivate::bindTexture(const ImageWithBindOptions &imageWithOptions, bool *newTextureCreated)
{
    QOpenGLTextureCache::BindResult result = QOpenGLTextureCache::cacheForContext(ctx)->bindTexture(ctx,
                                                                                                    imageWithOptions.image,
                                                                                                    imageWithOptions.options);
    if (newTextureCreated)
        *newTextureCreated = result.flags.testFlag(QOpenGLTextureCache::BindResultFlag::NewTexture);
    return result.id;
}